

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForceMatrixDecomposition.cpp
# Opt level: O0

void __thiscall
OpenMD::ForceMatrixDecomposition::buildNeighborList
          (ForceMatrixDecomposition *this,vector<int,_std::allocator<int>_> *neighborList,
          vector<int,_std::allocator<int>_> *point,
          vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_> *savedPositions
          )

{
  double dVar1;
  int iVar2;
  bool bVar3;
  int *piVar4;
  double *pdVar5;
  uint *puVar6;
  reference piVar7;
  vector<int,_std::allocator<int>_> *in_RDX;
  int iVar8;
  long in_RDI;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  double extraout_XMM0_Qa_01;
  RealType RVar9;
  int i_1;
  int j2_1;
  int j1_1;
  iterator j2;
  int m2;
  Vector3i m2v;
  iterator os;
  int j_1;
  int j1;
  int j;
  int i;
  int nCtot;
  RealType Wc;
  RealType Wb;
  RealType Wa;
  Vector3d CxA;
  Vector3d BxC;
  Vector3d AxB;
  Vector3d C;
  Vector3d B;
  Vector3d A;
  int cellIndex;
  Vector3i whichCell;
  Vector3d dr;
  Vector3d scaled;
  Vector3d rs;
  Mat3x3d invBox;
  Mat3x3d box;
  Snapshot *snap_;
  bool doAllPairs;
  int len;
  Snapshot *in_stack_fffffffffffff908;
  undefined4 in_stack_fffffffffffff910;
  undefined4 in_stack_fffffffffffff914;
  uint uVar10;
  Vector<double,_3U> *in_stack_fffffffffffff918;
  undefined4 in_stack_fffffffffffff920;
  uint in_stack_fffffffffffff924;
  RectMatrix<double,_3U,_3U> *in_stack_fffffffffffff928;
  Vector<double,_3U> *in_stack_fffffffffffff930;
  DataStorage *in_stack_fffffffffffff938;
  int *in_stack_fffffffffffff948;
  vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
  *in_stack_fffffffffffff950;
  Vector3<double> *in_stack_fffffffffffff970;
  Vector3<double> *in_stack_fffffffffffff978;
  Vector3d *in_stack_fffffffffffff988;
  Snapshot *in_stack_fffffffffffff990;
  int local_3fc;
  int local_3e0;
  int local_3dc;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_3b8;
  int local_3ac;
  Vector3<int> local_39c;
  Vector3<int> *local_390;
  __normal_iterator<OpenMD::Vector3<int>_*,_std::vector<OpenMD::Vector3<int>,_std::allocator<OpenMD::Vector3<int>_>_>_>
  local_388;
  uint local_37c;
  int local_360;
  uint local_35c;
  int local_340;
  int local_33c;
  double local_338;
  double local_330;
  double local_328;
  undefined1 local_2c0 [48];
  undefined1 local_290 [48];
  undefined1 local_260 [312];
  int local_128;
  Vector3<int> local_124 [3];
  Vector<double,_3U> local_100 [8];
  Snapshot *local_30;
  byte local_25;
  uint local_24;
  vector<int,_std::allocator<int>_> *local_18;
  
  local_18 = in_RDX;
  std::vector<int,_std::allocator<int>_>::clear((vector<int,_std::allocator<int>_> *)0x36b174);
  std::vector<int,_std::allocator<int>_>::clear((vector<int,_std::allocator<int>_> *)0x36b181);
  local_24 = 0;
  local_25 = 0;
  local_30 = SnapshotManager::getCurrentSnapshot(*(SnapshotManager **)(in_RDI + 0x10));
  SquareMatrix3<double>::SquareMatrix3((SquareMatrix3<double> *)0x36b1ba);
  SquareMatrix3<double>::SquareMatrix3((SquareMatrix3<double> *)0x36b1c7);
  Vector3<double>::Vector3((Vector3<double> *)0x36b1d6);
  Vector3<double>::Vector3((Vector3<double> *)0x36b1e5);
  Vector3<double>::Vector3((Vector3<double> *)0x36b1f4);
  Vector3<int>::Vector3((Vector3<int> *)0x36b203);
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::clear((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
           *)0x36b219);
  std::vector<int,_std::allocator<int>_>::resize
            ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff930,
             (size_type)in_stack_fffffffffffff928);
  if ((*(byte *)(in_RDI + 0x3d) & 1) == 0) {
    Snapshot::getBoundingBox(in_stack_fffffffffffff908);
    SquareMatrix3<double>::operator=
              ((SquareMatrix3<double> *)
               CONCAT44(in_stack_fffffffffffff914,in_stack_fffffffffffff910),
               (SquareMatrix3<double> *)in_stack_fffffffffffff908);
    SquareMatrix3<double>::~SquareMatrix3((SquareMatrix3<double> *)0x36b288);
    Snapshot::getInvBoundingBox(in_stack_fffffffffffff908);
    SquareMatrix3<double>::operator=
              ((SquareMatrix3<double> *)
               CONCAT44(in_stack_fffffffffffff914,in_stack_fffffffffffff910),
               (SquareMatrix3<double> *)in_stack_fffffffffffff908);
    SquareMatrix3<double>::~SquareMatrix3((SquareMatrix3<double> *)0x36b2c3);
  }
  else {
    Snapshot::getHmat(in_stack_fffffffffffff908);
    SquareMatrix3<double>::operator=
              ((SquareMatrix3<double> *)
               CONCAT44(in_stack_fffffffffffff914,in_stack_fffffffffffff910),
               (SquareMatrix3<double> *)in_stack_fffffffffffff908);
    SquareMatrix3<double>::~SquareMatrix3((SquareMatrix3<double> *)0x36b381);
    Snapshot::getInvHmat(in_stack_fffffffffffff908);
    SquareMatrix3<double>::operator=
              ((SquareMatrix3<double> *)
               CONCAT44(in_stack_fffffffffffff914,in_stack_fffffffffffff910),
               (SquareMatrix3<double> *)in_stack_fffffffffffff908);
    SquareMatrix3<double>::~SquareMatrix3((SquareMatrix3<double> *)0x36b3bc);
  }
  RectMatrix<double,_3U,_3U>::getColumn(in_stack_fffffffffffff928,in_stack_fffffffffffff924);
  Vector3<double>::Vector3
            ((Vector3<double> *)CONCAT44(in_stack_fffffffffffff914,in_stack_fffffffffffff910),
             (Vector<double,_3U> *)in_stack_fffffffffffff908);
  RectMatrix<double,_3U,_3U>::getColumn(in_stack_fffffffffffff928,in_stack_fffffffffffff924);
  Vector3<double>::Vector3
            ((Vector3<double> *)CONCAT44(in_stack_fffffffffffff914,in_stack_fffffffffffff910),
             (Vector<double,_3U> *)in_stack_fffffffffffff908);
  RectMatrix<double,_3U,_3U>::getColumn(in_stack_fffffffffffff928,in_stack_fffffffffffff924);
  Vector3<double>::Vector3
            ((Vector3<double> *)CONCAT44(in_stack_fffffffffffff914,in_stack_fffffffffffff910),
             (Vector<double,_3U> *)in_stack_fffffffffffff908);
  cross<double>(in_stack_fffffffffffff978,in_stack_fffffffffffff970);
  cross<double>(in_stack_fffffffffffff978,in_stack_fffffffffffff970);
  cross<double>(in_stack_fffffffffffff978,in_stack_fffffffffffff970);
  Vector<double,_3U>::normalize
            ((Vector<double,_3U> *)CONCAT44(in_stack_fffffffffffff914,in_stack_fffffffffffff910));
  Vector<double,_3U>::normalize
            ((Vector<double,_3U> *)CONCAT44(in_stack_fffffffffffff914,in_stack_fffffffffffff910));
  Vector<double,_3U>::normalize
            ((Vector<double,_3U> *)CONCAT44(in_stack_fffffffffffff914,in_stack_fffffffffffff910));
  iVar8 = (int)local_260;
  dot<double,3u>((Vector<double,_3U> *)CONCAT44(in_stack_fffffffffffff924,in_stack_fffffffffffff920)
                 ,in_stack_fffffffffffff918);
  std::abs(iVar8);
  iVar8 = (int)local_290;
  local_328 = extraout_XMM0_Qa;
  dot<double,3u>((Vector<double,_3U> *)CONCAT44(in_stack_fffffffffffff924,in_stack_fffffffffffff920)
                 ,in_stack_fffffffffffff918);
  std::abs(iVar8);
  iVar8 = (int)local_2c0;
  local_330 = extraout_XMM0_Qa_00;
  dot<double,3u>((Vector<double,_3U> *)CONCAT44(in_stack_fffffffffffff924,in_stack_fffffffffffff920)
                 ,in_stack_fffffffffffff918);
  std::abs(iVar8);
  dVar1 = *(double *)(in_RDI + 0x50);
  local_338 = extraout_XMM0_Qa_01;
  piVar4 = Vector3<int>::x((Vector3<int> *)(in_RDI + 0x288));
  *piVar4 = (int)(local_328 / dVar1);
  dVar1 = *(double *)(in_RDI + 0x50);
  piVar4 = Vector3<int>::y((Vector3<int> *)(in_RDI + 0x288));
  *piVar4 = (int)(local_330 / dVar1);
  dVar1 = *(double *)(in_RDI + 0x50);
  piVar4 = Vector3<int>::z((Vector3<int> *)(in_RDI + 0x288));
  *piVar4 = (int)(local_338 / dVar1);
  piVar4 = Vector3<int>::x((Vector3<int> *)(in_RDI + 0x288));
  if (*piVar4 < 3) {
    local_25 = 1;
  }
  piVar4 = Vector3<int>::y((Vector3<int> *)(in_RDI + 0x288));
  if (*piVar4 < 3) {
    local_25 = 1;
  }
  piVar4 = Vector3<int>::z((Vector3<int> *)(in_RDI + 0x288));
  if (*piVar4 < 3) {
    local_25 = 1;
  }
  piVar4 = Vector3<int>::x((Vector3<int> *)(in_RDI + 0x288));
  iVar8 = *piVar4;
  piVar4 = Vector3<int>::y((Vector3<int> *)(in_RDI + 0x288));
  iVar2 = *piVar4;
  piVar4 = Vector3<int>::z((Vector3<int> *)(in_RDI + 0x288));
  local_33c = iVar8 * iVar2 * *piVar4;
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::resize((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
            *)in_stack_fffffffffffff930,(size_type)in_stack_fffffffffffff928);
  if ((local_25 & 1) == 0) {
    for (local_340 = 0; local_340 < *(int *)(in_RDI + 0x2b4); local_340 = local_340 + 1) {
      std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::operator[]
                (&(local_30->cgData).position,(long)local_340);
      Vector3<double>::operator=
                ((Vector3<double> *)CONCAT44(in_stack_fffffffffffff914,in_stack_fffffffffffff910),
                 (Vector3<double> *)in_stack_fffffffffffff908);
      OpenMD::operator*((RectMatrix<double,_3U,_3U> *)in_stack_fffffffffffff938,
                        in_stack_fffffffffffff930);
      Vector3<double>::operator=
                ((Vector3<double> *)in_stack_fffffffffffff918,
                 (Vector<double,_3U> *)CONCAT44(in_stack_fffffffffffff914,in_stack_fffffffffffff910)
                );
      for (local_35c = 0; (int)local_35c < 3; local_35c = local_35c + 1) {
        Vector<double,_3U>::operator[](local_100,local_35c);
        RVar9 = roundMe((RealType *)CONCAT44(in_stack_fffffffffffff914,in_stack_fffffffffffff910));
        pdVar5 = Vector<double,_3U>::operator[](local_100,local_35c);
        *pdVar5 = *pdVar5 - RVar9;
        pdVar5 = Vector<double,_3U>::operator[](local_100,local_35c);
        *pdVar5 = *pdVar5 + 0.5;
        pdVar5 = Vector<double,_3U>::operator[](local_100,local_35c);
        if (1.0 <= *pdVar5) {
          pdVar5 = Vector<double,_3U>::operator[](local_100,local_35c);
          *pdVar5 = *pdVar5 - 1.0;
        }
      }
      piVar4 = Vector3<int>::x((Vector3<int> *)(in_RDI + 0x288));
      iVar8 = *piVar4;
      pdVar5 = Vector3<double>::x((Vector3<double> *)local_100);
      dVar1 = *pdVar5;
      piVar4 = Vector3<int>::x(local_124);
      *piVar4 = (int)((double)iVar8 * dVar1);
      piVar4 = Vector3<int>::y((Vector3<int> *)(in_RDI + 0x288));
      iVar8 = *piVar4;
      pdVar5 = Vector3<double>::y((Vector3<double> *)local_100);
      dVar1 = *pdVar5;
      piVar4 = Vector3<int>::y(local_124);
      *piVar4 = (int)((double)iVar8 * dVar1);
      piVar4 = Vector3<int>::z((Vector3<int> *)(in_RDI + 0x288));
      iVar8 = *piVar4;
      pdVar5 = Vector3<double>::z((Vector3<double> *)local_100);
      dVar1 = *pdVar5;
      piVar4 = Vector3<int>::z(local_124);
      *piVar4 = (int)((double)iVar8 * dVar1);
      local_128 = Vlinear<int>((Vector3<int> *)
                               CONCAT44(in_stack_fffffffffffff924,in_stack_fffffffffffff920),
                               (Vector3<int> *)in_stack_fffffffffffff918);
      std::
      vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
      ::operator[]((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                    *)(in_RDI + 0x298),(long)local_128);
      std::vector<int,_std::allocator<int>_>::push_back
                ((vector<int,_std::allocator<int>_> *)
                 CONCAT44(in_stack_fffffffffffff924,in_stack_fffffffffffff920),
                 (value_type_conflict1 *)in_stack_fffffffffffff918);
    }
    for (local_360 = 0; local_360 < *(int *)(in_RDI + 0x2b4); local_360 = local_360 + 1) {
      std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::operator[]
                (&(local_30->cgData).position,(long)local_360);
      Vector3<double>::operator=
                ((Vector3<double> *)CONCAT44(in_stack_fffffffffffff914,in_stack_fffffffffffff910),
                 (Vector3<double> *)in_stack_fffffffffffff908);
      uVar10 = local_24;
      puVar6 = (uint *)std::vector<int,_std::allocator<int>_>::operator[](local_18,(long)local_360);
      *puVar6 = uVar10;
      OpenMD::operator*((RectMatrix<double,_3U,_3U> *)in_stack_fffffffffffff938,
                        in_stack_fffffffffffff930);
      Vector3<double>::operator=
                ((Vector3<double> *)in_stack_fffffffffffff918,
                 (Vector<double,_3U> *)CONCAT44(in_stack_fffffffffffff914,in_stack_fffffffffffff910)
                );
      for (local_37c = 0; (int)local_37c < 3; local_37c = local_37c + 1) {
        Vector<double,_3U>::operator[](local_100,local_37c);
        RVar9 = roundMe((RealType *)CONCAT44(in_stack_fffffffffffff914,in_stack_fffffffffffff910));
        pdVar5 = Vector<double,_3U>::operator[](local_100,local_37c);
        *pdVar5 = *pdVar5 - RVar9;
        pdVar5 = Vector<double,_3U>::operator[](local_100,local_37c);
        *pdVar5 = *pdVar5 + 0.5;
        pdVar5 = Vector<double,_3U>::operator[](local_100,local_37c);
        if (1.0 <= *pdVar5) {
          pdVar5 = Vector<double,_3U>::operator[](local_100,local_37c);
          *pdVar5 = *pdVar5 - 1.0;
        }
      }
      piVar4 = Vector3<int>::x((Vector3<int> *)(in_RDI + 0x288));
      iVar8 = *piVar4;
      pdVar5 = Vector3<double>::x((Vector3<double> *)local_100);
      dVar1 = *pdVar5;
      piVar4 = Vector3<int>::x(local_124);
      *piVar4 = (int)((double)iVar8 * dVar1);
      piVar4 = Vector3<int>::y((Vector3<int> *)(in_RDI + 0x288));
      iVar8 = *piVar4;
      pdVar5 = Vector3<double>::y((Vector3<double> *)local_100);
      dVar1 = *pdVar5;
      piVar4 = Vector3<int>::y(local_124);
      *piVar4 = (int)((double)iVar8 * dVar1);
      piVar4 = Vector3<int>::z((Vector3<int> *)(in_RDI + 0x288));
      iVar8 = *piVar4;
      pdVar5 = Vector3<double>::z((Vector3<double> *)local_100);
      dVar1 = *pdVar5;
      piVar4 = Vector3<int>::z(local_124);
      *piVar4 = (int)((double)iVar8 * dVar1);
      local_388._M_current =
           (Vector3<int> *)
           std::vector<OpenMD::Vector3<int>,_std::allocator<OpenMD::Vector3<int>_>_>::begin
                     ((vector<OpenMD::Vector3<int>,_std::allocator<OpenMD::Vector3<int>_>_> *)
                      in_stack_fffffffffffff908);
      while( true ) {
        local_390 = (Vector3<int> *)
                    std::vector<OpenMD::Vector3<int>,_std::allocator<OpenMD::Vector3<int>_>_>::end
                              ((vector<OpenMD::Vector3<int>,_std::allocator<OpenMD::Vector3<int>_>_>
                                *)in_stack_fffffffffffff908);
        bVar3 = __gnu_cxx::operator!=
                          ((__normal_iterator<OpenMD::Vector3<int>_*,_std::vector<OpenMD::Vector3<int>,_std::allocator<OpenMD::Vector3<int>_>_>_>
                            *)CONCAT44(in_stack_fffffffffffff914,in_stack_fffffffffffff910),
                           (__normal_iterator<OpenMD::Vector3<int>_*,_std::vector<OpenMD::Vector3<int>,_std::allocator<OpenMD::Vector3<int>_>_>_>
                            *)in_stack_fffffffffffff908);
        if (!bVar3) break;
        __gnu_cxx::
        __normal_iterator<OpenMD::Vector3<int>_*,_std::vector<OpenMD::Vector3<int>,_std::allocator<OpenMD::Vector3<int>_>_>_>
        ::operator*(&local_388);
        OpenMD::operator+((Vector<int,_3U> *)in_stack_fffffffffffff918,
                          (Vector<int,_3U> *)
                          CONCAT44(in_stack_fffffffffffff914,in_stack_fffffffffffff910));
        Vector3<int>::Vector3
                  ((Vector3<int> *)CONCAT44(in_stack_fffffffffffff914,in_stack_fffffffffffff910),
                   (Vector<int,_3U> *)in_stack_fffffffffffff908);
        piVar4 = Vector3<int>::x(&local_39c);
        iVar8 = *piVar4;
        piVar4 = Vector3<int>::x((Vector3<int> *)(in_RDI + 0x288));
        if (iVar8 < *piVar4) {
          piVar4 = Vector3<int>::x(&local_39c);
          if (*piVar4 < 0) {
            piVar4 = Vector3<int>::x((Vector3<int> *)(in_RDI + 0x288));
            iVar8 = *piVar4;
            piVar4 = Vector3<int>::x(&local_39c);
            *piVar4 = iVar8 + -1;
          }
        }
        else {
          piVar4 = Vector3<int>::x(&local_39c);
          *piVar4 = 0;
        }
        piVar4 = Vector3<int>::y(&local_39c);
        iVar8 = *piVar4;
        piVar4 = Vector3<int>::y((Vector3<int> *)(in_RDI + 0x288));
        if (iVar8 < *piVar4) {
          piVar4 = Vector3<int>::y(&local_39c);
          if (*piVar4 < 0) {
            in_stack_fffffffffffff990 =
                 (Snapshot *)Vector3<int>::y((Vector3<int> *)(in_RDI + 0x288));
            iVar8 = *(int *)&(in_stack_fffffffffffff990->atomData).position.
                             super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                             ._M_impl.super__Vector_impl_data._M_start;
            in_stack_fffffffffffff988 = (Vector3d *)Vector3<int>::y(&local_39c);
            *(int *)(in_stack_fffffffffffff988->super_Vector<double,_3U>).data_ = iVar8 + -1;
          }
        }
        else {
          piVar4 = Vector3<int>::y(&local_39c);
          *piVar4 = 0;
        }
        piVar4 = Vector3<int>::z(&local_39c);
        iVar8 = *piVar4;
        piVar4 = Vector3<int>::z((Vector3<int> *)(in_RDI + 0x288));
        if (iVar8 < *piVar4) {
          piVar4 = Vector3<int>::z(&local_39c);
          if (*piVar4 < 0) {
            in_stack_fffffffffffff950 =
                 (vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_> *)
                 Vector3<int>::z((Vector3<int> *)(in_RDI + 0x288));
            iVar8 = *(int *)&(in_stack_fffffffffffff950->
                             super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                             )._M_impl.super__Vector_impl_data._M_start;
            in_stack_fffffffffffff948 = Vector3<int>::z(&local_39c);
            *in_stack_fffffffffffff948 = iVar8 + -1;
          }
        }
        else {
          piVar4 = Vector3<int>::z(&local_39c);
          *piVar4 = 0;
        }
        local_3ac = Vlinear<int>((Vector3<int> *)
                                 CONCAT44(in_stack_fffffffffffff924,in_stack_fffffffffffff920),
                                 (Vector3<int> *)in_stack_fffffffffffff918);
        std::
        vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
        ::operator[]((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                      *)(in_RDI + 0x298),(long)local_3ac);
        local_3b8._M_current =
             (int *)std::vector<int,_std::allocator<int>_>::begin
                              ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff908);
        while( true ) {
          std::
          vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
          ::operator[]((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                        *)(in_RDI + 0x298),(long)local_3ac);
          std::vector<int,_std::allocator<int>_>::end
                    ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff908);
          bVar3 = __gnu_cxx::operator!=
                            ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                             CONCAT44(in_stack_fffffffffffff914,in_stack_fffffffffffff910),
                             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                             in_stack_fffffffffffff908);
          if (!bVar3) break;
          piVar7 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                   operator*(&local_3b8);
          if (local_360 <= *piVar7) {
            in_stack_fffffffffffff938 = &local_30->cgData;
            piVar7 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                     operator*(&local_3b8);
            std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::
            operator[](&in_stack_fffffffffffff938->position,(long)*piVar7);
            OpenMD::operator-(in_stack_fffffffffffff918,
                              (Vector<double,_3U> *)
                              CONCAT44(in_stack_fffffffffffff914,in_stack_fffffffffffff910));
            Vector3<double>::operator=
                      ((Vector3<double> *)in_stack_fffffffffffff918,
                       (Vector<double,_3U> *)
                       CONCAT44(in_stack_fffffffffffff914,in_stack_fffffffffffff910));
            if ((*(byte *)(in_RDI + 0x3d) & 1) != 0) {
              Snapshot::wrapVector(in_stack_fffffffffffff990,in_stack_fffffffffffff988);
            }
            in_stack_fffffffffffff930 =
                 (Vector<double,_3U> *)
                 Vector<double,_3U>::lengthSquare((Vector<double,_3U> *)0x36c4da);
            if ((double)in_stack_fffffffffffff930 < *(double *)(in_RDI + 0x58)) {
              __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
              operator*(&local_3b8);
              std::vector<int,_std::allocator<int>_>::push_back
                        ((vector<int,_std::allocator<int>_> *)
                         CONCAT44(in_stack_fffffffffffff924,in_stack_fffffffffffff920),
                         (value_type_conflict1 *)in_stack_fffffffffffff918);
              local_24 = local_24 + 1;
            }
          }
          __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
                    (&local_3b8);
        }
        __gnu_cxx::
        __normal_iterator<OpenMD::Vector3<int>_*,_std::vector<OpenMD::Vector3<int>,_std::allocator<OpenMD::Vector3<int>_>_>_>
        ::operator++(&local_388);
      }
    }
  }
  else {
    for (local_3dc = 0; local_3dc < *(int *)(in_RDI + 0x2b4); local_3dc = local_3dc + 1) {
      in_stack_fffffffffffff924 = local_24;
      puVar6 = (uint *)std::vector<int,_std::allocator<int>_>::operator[](local_18,(long)local_3dc);
      *puVar6 = in_stack_fffffffffffff924;
      std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::operator[]
                (&(local_30->cgData).position,(long)local_3dc);
      Vector3<double>::operator=
                ((Vector3<double> *)CONCAT44(in_stack_fffffffffffff914,in_stack_fffffffffffff910),
                 (Vector3<double> *)in_stack_fffffffffffff908);
      for (local_3e0 = local_3dc; local_3e0 < *(int *)(in_RDI + 0x2b4); local_3e0 = local_3e0 + 1) {
        std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::operator[]
                  (&(local_30->cgData).position,(long)local_3e0);
        OpenMD::operator-(in_stack_fffffffffffff918,
                          (Vector<double,_3U> *)
                          CONCAT44(in_stack_fffffffffffff914,in_stack_fffffffffffff910));
        Vector3<double>::operator=
                  ((Vector3<double> *)in_stack_fffffffffffff918,
                   (Vector<double,_3U> *)
                   CONCAT44(in_stack_fffffffffffff914,in_stack_fffffffffffff910));
        if ((*(byte *)(in_RDI + 0x3d) & 1) != 0) {
          Snapshot::wrapVector(in_stack_fffffffffffff990,in_stack_fffffffffffff988);
        }
        in_stack_fffffffffffff918 =
             (Vector<double,_3U> *)Vector<double,_3U>::lengthSquare((Vector<double,_3U> *)0x36c6a0);
        if ((double)in_stack_fffffffffffff918 < *(double *)(in_RDI + 0x58)) {
          std::vector<int,_std::allocator<int>_>::push_back
                    ((vector<int,_std::allocator<int>_> *)
                     CONCAT44(in_stack_fffffffffffff924,in_stack_fffffffffffff920),
                     (value_type_conflict1 *)in_stack_fffffffffffff918);
          local_24 = local_24 + 1;
        }
      }
    }
  }
  uVar10 = local_24;
  puVar6 = (uint *)std::vector<int,_std::allocator<int>_>::operator[]
                             (local_18,(long)*(int *)(in_RDI + 0x2b4));
  *puVar6 = uVar10;
  std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::clear
            ((vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_> *)0x36c755)
  ;
  std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::reserve
            (in_stack_fffffffffffff950,(size_type)in_stack_fffffffffffff948);
  for (local_3fc = 0; local_3fc < *(int *)(in_RDI + 0x2b4); local_3fc = local_3fc + 1) {
    std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::operator[]
              (&(local_30->cgData).position,(long)local_3fc);
    std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::push_back
              ((vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_> *)
               CONCAT44(in_stack_fffffffffffff924,in_stack_fffffffffffff920),
               (value_type *)in_stack_fffffffffffff918);
  }
  SquareMatrix3<double>::~SquareMatrix3((SquareMatrix3<double> *)0x36c7ed);
  SquareMatrix3<double>::~SquareMatrix3((SquareMatrix3<double> *)0x36c7fa);
  return;
}

Assistant:

void ForceMatrixDecomposition::buildNeighborList(
      vector<int>& neighborList, vector<int>& point,
      vector<Vector3d>& savedPositions) {
    neighborList.clear();
    point.clear();
    int len = 0;

    bool doAllPairs = false;

    Snapshot* snap_ = sman_->getCurrentSnapshot();
    Mat3x3d box;
    Mat3x3d invBox;

    Vector3d rs, scaled, dr;
    Vector3i whichCell;
    int cellIndex;

#ifdef IS_MPI
    cellListRow_.clear();
    cellListCol_.clear();
    point.resize(nGroupsInRow_ + 1);
#else
    cellList_.clear();
    point.resize(nGroups_ + 1);
#endif

    if (!usePeriodicBoundaryConditions_) {
      box    = snap_->getBoundingBox();
      invBox = snap_->getInvBoundingBox();
    } else {
      box    = snap_->getHmat();
      invBox = snap_->getInvHmat();
    }

    Vector3d A = box.getColumn(0);
    Vector3d B = box.getColumn(1);
    Vector3d C = box.getColumn(2);

    // Required for triclinic cells
    Vector3d AxB = cross(A, B);
    Vector3d BxC = cross(B, C);
    Vector3d CxA = cross(C, A);

    // unit vectors perpendicular to the faces of the triclinic cell:
    AxB.normalize();
    BxC.normalize();
    CxA.normalize();

    // A set of perpendicular lengths in triclinic cells:
    RealType Wa = abs(dot(A, BxC));
    RealType Wb = abs(dot(B, CxA));
    RealType Wc = abs(dot(C, AxB));

    nCells_.x() = int(Wa / rList_);
    nCells_.y() = int(Wb / rList_);
    nCells_.z() = int(Wc / rList_);

    // handle small boxes where the cell offsets can end up repeating cells
    if (nCells_.x() < 3) doAllPairs = true;
    if (nCells_.y() < 3) doAllPairs = true;
    if (nCells_.z() < 3) doAllPairs = true;

    int nCtot = nCells_.x() * nCells_.y() * nCells_.z();

#ifdef IS_MPI
    cellListRow_.resize(nCtot);
    cellListCol_.resize(nCtot);
#else
    cellList_.resize(nCtot);
#endif

    if (!doAllPairs) {
#ifdef IS_MPI

      for (int i = 0; i < nGroupsInRow_; i++) {
        rs = cgRowData.position[i];

        // scaled positions relative to the box vectors
        scaled = invBox * rs;

        // wrap the vector back into the unit box by subtracting integer box
        // numbers
        for (int j = 0; j < 3; j++) {
          scaled[j] -= roundMe(scaled[j]);
          scaled[j] += 0.5;
          // Handle the special case when an object is exactly on the
          // boundary (a scaled coordinate of 1.0 is the same as
          // scaled coordinate of 0.0)
          if (scaled[j] >= 1.0) scaled[j] -= 1.0;
        }

        // find xyz-indices of cell that cutoffGroup is in.
        whichCell.x() = int(nCells_.x() * scaled.x());
        whichCell.y() = int(nCells_.y() * scaled.y());
        whichCell.z() = int(nCells_.z() * scaled.z());

        // find single index of this cell:
        cellIndex = Vlinear(whichCell, nCells_);

        // add this cutoff group to the list of groups in this cell;
        cellListRow_[cellIndex].push_back(i);
      }
      for (int i = 0; i < nGroupsInCol_; i++) {
        rs = cgColData.position[i];

        // scaled positions relative to the box vectors
        scaled = invBox * rs;

        // wrap the vector back into the unit box by subtracting integer box
        // numbers
        for (int j = 0; j < 3; j++) {
          scaled[j] -= roundMe(scaled[j]);
          scaled[j] += 0.5;
          // Handle the special case when an object is exactly on the
          // boundary (a scaled coordinate of 1.0 is the same as
          // scaled coordinate of 0.0)
          if (scaled[j] >= 1.0) scaled[j] -= 1.0;
        }

        // find xyz-indices of cell that cutoffGroup is in.
        whichCell.x() = int(nCells_.x() * scaled.x());
        whichCell.y() = int(nCells_.y() * scaled.y());
        whichCell.z() = int(nCells_.z() * scaled.z());

        // find single index of this cell:
        cellIndex = Vlinear(whichCell, nCells_);

        // add this cutoff group to the list of groups in this cell;
        cellListCol_[cellIndex].push_back(i);
      }

#else
      for (int i = 0; i < nGroups_; i++) {
        rs = snap_->cgData.position[i];

        // scaled positions relative to the box vectors
        scaled = invBox * rs;

        // wrap the vector back into the unit box by subtracting integer box
        // numbers
        for (int j = 0; j < 3; j++) {
          scaled[j] -= roundMe(scaled[j]);
          scaled[j] += 0.5;
          // Handle the special case when an object is exactly on the
          // boundary (a scaled coordinate of 1.0 is the same as
          // scaled coordinate of 0.0)
          if (scaled[j] >= 1.0) scaled[j] -= 1.0;
        }

        // find xyz-indices of cell that cutoffGroup is in.
        whichCell.x() = int(nCells_.x() * scaled.x());
        whichCell.y() = int(nCells_.y() * scaled.y());
        whichCell.z() = int(nCells_.z() * scaled.z());

        // find single index of this cell:
        cellIndex = Vlinear(whichCell, nCells_);

        // add this cutoff group to the list of groups in this cell;
        cellList_[cellIndex].push_back(i);
      }

#endif

#ifdef IS_MPI
      for (int j1 = 0; j1 < nGroupsInRow_; j1++) {
        rs = cgRowData.position[j1];
#else

      for (int j1 = 0; j1 < nGroups_; j1++) {
        rs = snap_->cgData.position[j1];
#endif
        point[j1] = len;

        // scaled positions relative to the box vectors
        scaled = invBox * rs;

        // wrap the vector back into the unit box by subtracting integer box
        // numbers
        for (int j = 0; j < 3; j++) {
          scaled[j] -= roundMe(scaled[j]);
          scaled[j] += 0.5;
          // Handle the special case when an object is exactly on the
          // boundary (a scaled coordinate of 1.0 is the same as
          // scaled coordinate of 0.0)
          if (scaled[j] >= 1.0) scaled[j] -= 1.0;
        }

        // find xyz-indices of cell that cutoffGroup is in.
        whichCell.x() = int(nCells_.x() * scaled.x());
        whichCell.y() = int(nCells_.y() * scaled.y());
        whichCell.z() = int(nCells_.z() * scaled.z());

        for (vector<Vector3i>::iterator os = cellOffsets_.begin();
             os != cellOffsets_.end(); ++os) {
          Vector3i m2v = whichCell + (*os);

          if (m2v.x() >= nCells_.x()) {
            m2v.x() = 0;
          } else if (m2v.x() < 0) {
            m2v.x() = nCells_.x() - 1;
          }

          if (m2v.y() >= nCells_.y()) {
            m2v.y() = 0;
          } else if (m2v.y() < 0) {
            m2v.y() = nCells_.y() - 1;
          }

          if (m2v.z() >= nCells_.z()) {
            m2v.z() = 0;
          } else if (m2v.z() < 0) {
            m2v.z() = nCells_.z() - 1;
          }
          int m2 = Vlinear(m2v, nCells_);
#ifdef IS_MPI
          for (vector<int>::iterator j2 = cellListCol_[m2].begin();
               j2 != cellListCol_[m2].end(); ++j2) {
            // In parallel, we need to visit *all* pairs of row
            // & column indicies and will divide labor in the
            // force evaluation later.
            dr = cgColData.position[(*j2)] - rs;
            if (usePeriodicBoundaryConditions_) { snap_->wrapVector(dr); }
            if (dr.lengthSquare() < rListSq_) {
              neighborList.push_back((*j2));
              ++len;
            }
          }
#else
          for (vector<int>::iterator j2 = cellList_[m2].begin();
               j2 != cellList_[m2].end(); ++j2) {
            // Always do this if we're in different cells or if
            // we're in the same cell and the global index of
            // the j2 cutoff group is greater than or equal to
            // the j1 cutoff group.  Note that Rappaport's code
            // has a "less than" conditional here, but that
            // deals with atom-by-atom computation.  OpenMD
            // allows atoms within a single cutoff group to
            // interact with each other.

            if ((*j2) >= j1) {
              dr = snap_->cgData.position[(*j2)] - rs;
              if (usePeriodicBoundaryConditions_) { snap_->wrapVector(dr); }
              if (dr.lengthSquare() < rListSq_) {
                neighborList.push_back((*j2));
                ++len;
              }
            }
          }
#endif
        }
      }
    } else {
      // branch to do all cutoff group pairs
#ifdef IS_MPI
      for (int j1 = 0; j1 < nGroupsInRow_; j1++) {
        point[j1] = len;
        rs        = cgRowData.position[j1];
        for (int j2 = 0; j2 < nGroupsInCol_; j2++) {
          dr = cgColData.position[j2] - rs;
          if (usePeriodicBoundaryConditions_) { snap_->wrapVector(dr); }
          if (dr.lengthSquare() < rListSq_) {
            neighborList.push_back(j2);
            ++len;
          }
        }
      }
#else
      // include all groups here.
      for (int j1 = 0; j1 < nGroups_; j1++) {
        point[j1] = len;
        rs        = snap_->cgData.position[j1];
        // include self group interactions j2 == j1
        for (int j2 = j1; j2 < nGroups_; j2++) {
          dr = snap_->cgData.position[j2] - rs;
          if (usePeriodicBoundaryConditions_) { snap_->wrapVector(dr); }
          if (dr.lengthSquare() < rListSq_) {
            neighborList.push_back(j2);
            ++len;
          }
        }
      }
#endif
    }

#ifdef IS_MPI
    point[nGroupsInRow_] = len;
#else
    point[nGroups_] = len;
#endif

    // save the local cutoff group positions for the check that is
    // done on each loop:
    savedPositions.clear();
    savedPositions.reserve(nGroups_);
    for (int i = 0; i < nGroups_; i++)
      savedPositions.push_back(snap_->cgData.position[i]);
  }